

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.cpp
# Opt level: O0

void __thiscall
benchmarks::BenchmarkSuite::InvokeBenchmark
          (BenchmarkSuite *this,int64_t iterations,ParameterizedBenchmarkId *id,
          IBenchmarksResultsReporterPtr *resultsReporter)

{
  ParameterizedBenchmarkId *iterationsCount;
  bool bVar1;
  LoggerWriter *this_00;
  runtime_error *this_01;
  pointer ppVar2;
  element_type *peVar3;
  SerializedParamsMap *pSVar4;
  shared_ptr<benchmarks::IBenchmarksResultsReporter> local_348;
  undefined1 local_338 [8];
  MeasureBenchmarkContext ctx;
  BenchmarkId local_308;
  string local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  _Self local_248;
  BenchmarkId local_240;
  _Self local_1e0;
  iterator it;
  LoggerWriter local_1c8;
  IBenchmarksResultsReporterPtr *local_28;
  IBenchmarksResultsReporterPtr *resultsReporter_local;
  ParameterizedBenchmarkId *id_local;
  int64_t iterations_local;
  BenchmarkSuite *this_local;
  
  local_28 = resultsReporter;
  resultsReporter_local = (IBenchmarksResultsReporterPtr *)id;
  id_local = (ParameterizedBenchmarkId *)iterations;
  iterations_local = (int64_t)this;
  NamedLogger::Debug(&local_1c8,(NamedLogger *)s_logger);
  this_00 = NamedLogger::LoggerWriter::operator<<(&local_1c8,(char (*) [13])0x470338);
  NamedLogger::LoggerWriter::operator<<(this_00,(long *)&id_local);
  NamedLogger::LoggerWriter::~LoggerWriter(&local_1c8);
  ParameterizedBenchmarkId::GetId(&local_240,(ParameterizedBenchmarkId *)resultsReporter_local);
  local_1e0._M_node =
       (_Base_ptr)
       std::
       map<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
       ::find(&this->_benchmarks,&local_240);
  BenchmarkId::~BenchmarkId(&local_240);
  local_248._M_node =
       (_Base_ptr)
       std::
       map<benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
       ::end(&this->_benchmarks);
  bVar1 = std::operator==(&local_1e0,&local_248);
  iterationsCount = id_local;
  if (!bVar1) {
    std::shared_ptr<benchmarks::IBenchmarksResultsReporter>::shared_ptr(&local_348,local_28);
    MeasureBenchmarkContext::MeasureBenchmarkContext
              ((MeasureBenchmarkContext *)local_338,(int64_t)iterationsCount,&local_348);
    std::shared_ptr<benchmarks::IBenchmarksResultsReporter>::~shared_ptr(&local_348);
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>
             ::operator->(&local_1e0);
    peVar3 = std::
             __shared_ptr_access<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<benchmarks::IBenchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ppVar2->second);
    pSVar4 = ParameterizedBenchmarkId::GetParams_abi_cxx11_
                       ((ParameterizedBenchmarkId *)resultsReporter_local);
    (*peVar3->_vptr_IBenchmark[3])(peVar3,local_338,pSVar4);
    MeasureBenchmarkContext::~MeasureBenchmarkContext((MeasureBenchmarkContext *)local_338);
    return;
  }
  ctx._baselineRss._7_1_ = 1;
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParameterizedBenchmarkId::GetId(&local_308,(ParameterizedBenchmarkId *)resultsReporter_local);
  BenchmarkId::ToString_abi_cxx11_(&local_2a8,&local_308);
  std::operator+(&local_288,"Benchmark ",&local_2a8);
  std::operator+(&local_268,&local_288," not found!");
  std::runtime_error::runtime_error(this_01,(string *)&local_268);
  ctx._baselineRss._7_1_ = 0;
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BenchmarkSuite::InvokeBenchmark(int64_t iterations, const ParameterizedBenchmarkId& id, const IBenchmarksResultsReporterPtr& resultsReporter)
	{
		s_logger.Debug() << "iterations: " << iterations;

		auto it = _benchmarks.find(id.GetId());
		if (it == _benchmarks.end())
			throw std::runtime_error("Benchmark " + id.GetId().ToString() + " not found!");

		MeasureBenchmarkContext ctx(iterations, resultsReporter);
		it->second->Perform(ctx, id.GetParams());
	}